

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswClass.c
# Opt level: O3

void Ssw_ClassesPrintOne(Ssw_Cla_t *p,Aig_Obj_t *pRepr)

{
  uint uVar1;
  uint uVar2;
  Aig_Obj_t *pObj;
  uint uVar3;
  uint uVar4;
  int *piVar5;
  int iVar6;
  long lVar7;
  long lVar8;
  int level;
  Aig_Man_t *p_00;
  
  p_00 = (Aig_Man_t *)p;
  Abc_Print((int)p,"{ ");
  level = (int)p_00;
  piVar5 = p->pClassSizes;
  iVar6 = pRepr->Id;
  lVar7 = (long)iVar6;
  if (0 < piVar5[lVar7]) {
    lVar8 = 0;
    do {
      pObj = p->pId2Class[lVar7][lVar8];
      if (pObj != (Aig_Obj_t *)0x0) {
        uVar1 = pObj->Id;
        uVar2 = *(uint *)&pObj->field_0x1c;
        uVar3 = Aig_SupportSize(p->pAig,pObj);
        p_00 = p->pAig;
        uVar4 = Aig_NodeMffcSupp(p_00,pObj,0,(Vec_Ptr_t *)0x0);
        Abc_Print((int)p_00,"%d(%d,%d,%d) ",(ulong)uVar1,(ulong)(uVar2 & 0xffffff),(ulong)uVar3,
                  (ulong)uVar4);
        piVar5 = p->pClassSizes;
        iVar6 = pRepr->Id;
      }
      level = (int)p_00;
      lVar8 = lVar8 + 1;
      lVar7 = (long)iVar6;
    } while (lVar8 < piVar5[lVar7]);
  }
  Abc_Print(level,"}\n");
  return;
}

Assistant:

void Ssw_ClassesPrintOne( Ssw_Cla_t * p, Aig_Obj_t * pRepr )
{
    Aig_Obj_t * pObj;
    int i;
    Abc_Print( 1, "{ " );
    Ssw_ClassForEachNode( p, pRepr, pObj, i )
        Abc_Print( 1, "%d(%d,%d,%d) ", pObj->Id, pObj->Level,
        Aig_SupportSize(p->pAig,pObj), Aig_NodeMffcSupp(p->pAig,pObj,0,NULL) );
    Abc_Print( 1, "}\n" );
}